

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O2

void __thiscall
TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *cp)

{
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::TPZFrontMatrix
            (&this->super_TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>,
             &PTR_PTR_017c5598,
             &cp->super_TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>);
  (this->super_TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>).
  super_TPZAbstractFrontMatrix<float>.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZParFrontMatrix_017c5310;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fStore = (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.fExtAlloc;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>.super_TPZVec<TPZEqnArray<float>_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017d7430;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<float>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<float>_*,_10>,0);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}